

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::HasInterfaceInConflictOfVolatileSemantics
          (SpreadVolatileSemantics *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  DefUseManager *this_00;
  bool local_cd;
  allocator<char> local_b9;
  string local_b8;
  Instruction *local_98;
  Instruction *inst;
  uint32_t local_54;
  uint local_50;
  uint32_t var_id;
  uint32_t operand_index;
  ExecutionModel execution_model;
  Instruction *entry_point;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  SpreadVolatileSemantics *this_local;
  
  Pass::get_module(&this->super_Pass);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry_point);
  do {
    bVar2 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&entry_point);
    if (!bVar2) {
      return false;
    }
    _operand_index =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    var_id = opt::Instruction::GetSingleWordInOperand(_operand_index,0);
    for (local_50 = 3; uVar1 = local_50, uVar3 = opt::Instruction::NumInOperands(_operand_index),
        uVar1 < uVar3; local_50 = local_50 + 1) {
      local_54 = opt::Instruction::GetSingleWordInOperand(_operand_index,local_50);
      EntryFunctionsToSpreadVolatileSemanticsForVar
                ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&inst,this,local_54);
      bVar2 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::empty((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&inst);
      local_cd = false;
      if (!bVar2) {
        bVar2 = IsTargetForVolatileSemantics(this,local_54,var_id);
        local_cd = false;
        if (!bVar2) {
          local_cd = IsTargetUsedByNonVolatileLoadInEntryPoint(this,local_54,_operand_index);
        }
      }
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&inst);
      if (local_cd != false) {
        pIVar4 = Pass::context(&this->super_Pass);
        this_00 = IRContext::get_def_use_mgr(pIVar4);
        local_98 = analysis::DefUseManager::GetDef(this_00,local_54);
        pIVar4 = Pass::context(&this->super_Pass);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,
                   "Variable is a target for Volatile semantics for an entry point, but it is not for another entry point"
                   ,&local_b9);
        IRContext::EmitErrorMessage(pIVar4,&local_b8,local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        return true;
      }
    }
    InstructionList::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

bool SpreadVolatileSemantics::HasInterfaceInConflictOfVolatileSemantics() {
  for (Instruction& entry_point : get_module()->entry_points()) {
    spv::ExecutionModel execution_model =
        static_cast<spv::ExecutionModel>(entry_point.GetSingleWordInOperand(0));
    for (uint32_t operand_index = kOpEntryPointInOperandInterface;
         operand_index < entry_point.NumInOperands(); ++operand_index) {
      uint32_t var_id = entry_point.GetSingleWordInOperand(operand_index);
      if (!EntryFunctionsToSpreadVolatileSemanticsForVar(var_id).empty() &&
          !IsTargetForVolatileSemantics(var_id, execution_model) &&
          IsTargetUsedByNonVolatileLoadInEntryPoint(var_id, &entry_point)) {
        Instruction* inst = context()->get_def_use_mgr()->GetDef(var_id);
        context()->EmitErrorMessage(
            "Variable is a target for Volatile semantics for an entry point, "
            "but it is not for another entry point",
            inst);
        return true;
      }
    }
  }
  return false;
}